

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::UpdateTexture
          (DeviceContextVkImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 Slice,Box *DstBox,
          TextureSubResData *SubresData,RESOURCE_STATE_TRANSITION_MODE SrcBufferStateTransitionMode,
          RESOURCE_STATE_TRANSITION_MODE TextureStateTransitionMode)

{
  TextureVkImpl *TextureVk;
  string msg;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateTexture
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,MipLevel,Slice,DstBox,
             SubresData,SrcBufferStateTransitionMode,TextureStateTransitionMode);
  TextureVk = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(pTexture);
  if (((TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
       .m_Desc.Usage | USAGE_UNIFIED) != USAGE_SPARSE) {
    FormatString<char[80]>
              (&msg,(char (*) [80])
                    "Only USAGE_DEFAULT or USAGE_SPARSE textures should be updated with UpdateData()"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x91b);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (SubresData->pSrcBuffer == (IBuffer *)0x0) {
    UpdateTextureRegion(this,SubresData->pData,SubresData->Stride,SubresData->DepthStride,TextureVk,
                        MipLevel,Slice,DstBox,TextureStateTransitionMode);
  }
  else {
    FormatString<char[45]>(&msg,(char (*) [45])"Copying buffer to texture is not implemented");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x91f);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateTexture(ITexture*                      pTexture,
                                        Uint32                         MipLevel,
                                        Uint32                         Slice,
                                        const Box&                     DstBox,
                                        const TextureSubResData&       SubresData,
                                        RESOURCE_STATE_TRANSITION_MODE SrcBufferStateTransitionMode,
                                        RESOURCE_STATE_TRANSITION_MODE TextureStateTransitionMode)
{
    TDeviceContextBase::UpdateTexture(pTexture, MipLevel, Slice, DstBox, SubresData, SrcBufferStateTransitionMode, TextureStateTransitionMode);

    TextureVkImpl* pTexVk = ClassPtrCast<TextureVkImpl>(pTexture);
    // OpenGL backend uses UpdateData() to initialize textures, so we can't check the usage in ValidateUpdateTextureParams()
    DEV_CHECK_ERR(pTexVk->GetDesc().Usage == USAGE_DEFAULT || pTexVk->GetDesc().Usage == USAGE_SPARSE,
                  "Only USAGE_DEFAULT or USAGE_SPARSE textures should be updated with UpdateData()");

    if (SubresData.pSrcBuffer != nullptr)
    {
        UNSUPPORTED("Copying buffer to texture is not implemented");
    }
    else
    {
        UpdateTextureRegion(SubresData.pData, SubresData.Stride, SubresData.DepthStride, *pTexVk,
                            MipLevel, Slice, DstBox, TextureStateTransitionMode);
    }
}